

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteSpherical::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteSpherical *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChBodyFrame *pCVar19;
  ChBodyFrame *pCVar20;
  double dVar21;
  double dVar22;
  bool bVar23;
  char cVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  double dVar57;
  undefined1 auVar58 [16];
  double dVar59;
  undefined1 auVar60 [16];
  double local_38;
  double local_30;
  double local_28;
  
  pCVar19 = (this->super_ChLink).Body2;
  pCVar20 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->m_pos1,&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  dVar29 = local_38 -
           (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar53 = local_30 -
           (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar21 = local_28 -
           (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar29;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       dVar53 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar1 = vfmadd231sd_fma(auVar46,auVar31,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar21;
  auVar1 = vfmadd231sd_fma(auVar1,auVar41,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       dVar53 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar2 = vfmadd231sd_fma(auVar48,auVar31,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar2 = vfmadd231sd_fma(auVar2,auVar41,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar29;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       dVar53 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar3 = vfmadd231sd_fma(auVar50,auVar32,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar21;
  auVar3 = vfmadd231sd_fma(auVar3,auVar42,auVar6);
  dVar29 = (this->m_pos2).m_data[0] - auVar1._0_8_;
  dVar53 = (this->m_pos2).m_data[1] - auVar2._0_8_;
  dVar21 = (this->m_pos2).m_data[2] - auVar3._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar53 * dVar53;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar29;
  auVar4 = vfmadd231sd_fma(auVar33,auVar43,auVar43);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar21;
  auVar4 = vfmadd231sd_fma(auVar4,auVar52,auVar52);
  if (auVar4._0_8_ < 0.0) {
    dVar28 = sqrt(auVar4._0_8_);
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar28 = auVar4._0_8_;
  }
  bVar23 = 2.2250738585072014e-308 <= dVar28;
  dVar28 = 1.0 / dVar28;
  auVar25._0_8_ =
       (double)((ulong)bVar23 * (long)(dVar29 * dVar28) + (ulong)!bVar23 * 0x3ff0000000000000);
  auVar25._8_8_ = 0;
  dVar22 = (double)((ulong)bVar23 * (long)(dVar53 * dVar28));
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar22;
  dVar21 = (double)((ulong)bVar23 * (long)(dVar21 * dVar28));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar21;
  pCVar19 = (this->super_ChLink).Body1;
  pCVar20 = (this->super_ChLink).Body2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (this->m_dir1).m_data[0];
  dVar29 = (this->m_dir1).m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 8);
  auVar4 = vfmadd231sd_fma(auVar47,auVar34,auVar7);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (this->m_dir1).m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar4 = vfmadd231sd_fma(auVar4,auVar49,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar5 = vfmadd231sd_fma(auVar51,auVar34,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar5 = vfmadd231sd_fma(auVar5,auVar49,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x38);
  auVar6 = vfmadd231sd_fma(auVar44,auVar34,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar6 = vfmadd231sd_fma(auVar6,auVar49,auVar12);
  dVar29 = auVar5._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar5 = vfmadd231sd_fma(auVar54,auVar4,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar5 = vfmadd231sd_fma(auVar5,auVar6,auVar14);
  dVar53 = auVar5._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar31 = vfmadd231sd_fma(auVar56,auVar4,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar31 = vfmadd231sd_fma(auVar31,auVar6,auVar16);
  dVar55 = auVar31._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       dVar29 * *(double *)
                 ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar4 = vfmadd231sd_fma(auVar35,auVar4,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pCVar20->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar4 = vfmadd231sd_fma(auVar4,auVar6,auVar18);
  dVar28 = auVar4._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar22 * dVar28;
  auVar6 = vfmsub231sd_fma(auVar58,auVar31,auVar27);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar21 * dVar53;
  auVar4 = vfmsub231sd_fma(auVar45,auVar4,auVar25);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar55 * auVar25._0_8_;
  auVar5 = vfmsub231sd_fma(auVar60,auVar5,auVar26);
  dVar40 = auVar4._0_8_;
  dVar29 = dVar28 + auVar25._0_8_ + dVar40;
  dVar57 = auVar6._0_8_;
  dVar59 = auVar5._0_8_;
  if (0.0 <= dVar29) {
    dVar29 = dVar29 + 1.0;
    if (dVar29 < 0.0) {
      dVar29 = sqrt(dVar29);
    }
    else {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar29;
      auVar4 = vsqrtsd_avx(auVar36,auVar36);
      dVar29 = auVar4._0_8_;
    }
    dVar30 = dVar29 * 0.5;
    dVar29 = 0.5 / dVar29;
    dVar28 = (dVar59 - dVar55) * dVar29;
    dVar40 = (dVar53 - dVar21) * dVar29;
    dVar29 = (dVar22 - dVar57) * dVar29;
  }
  else {
    cVar24 = auVar25._0_8_ < dVar40;
    dVar29 = auVar25._0_8_;
    if ((bool)cVar24) {
      dVar29 = dVar40;
    }
    if (dVar29 < dVar28) {
      cVar24 = '\x02';
    }
    if (cVar24 == '\x02') {
      dVar29 = ((dVar28 - auVar25._0_8_) - dVar40) + 1.0;
      if (dVar29 < 0.0) {
        dVar30 = sqrt(dVar29);
      }
      else {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar29;
        auVar4 = vsqrtsd_avx(auVar38,auVar38);
        dVar30 = auVar4._0_8_;
      }
      dVar29 = dVar30 * 0.5;
      dVar30 = 0.5 / dVar30;
      dVar28 = (dVar21 + dVar53) * dVar30;
      dVar40 = (dVar55 + dVar59) * dVar30;
      dVar53 = dVar22 - dVar57;
    }
    else if (cVar24 == '\x01') {
      dVar29 = ((dVar40 - dVar28) - auVar25._0_8_) + 1.0;
      if (dVar29 < 0.0) {
        dVar30 = sqrt(dVar29);
      }
      else {
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar29;
        auVar4 = vsqrtsd_avx(auVar37,auVar37);
        dVar30 = auVar4._0_8_;
      }
      dVar40 = dVar30 * 0.5;
      dVar30 = 0.5 / dVar30;
      dVar29 = (dVar55 + dVar59) * dVar30;
      dVar28 = (dVar22 + dVar57) * dVar30;
      dVar53 = dVar53 - dVar21;
    }
    else {
      dVar29 = ((auVar25._0_8_ - dVar40) - dVar28) + 1.0;
      if (dVar29 < 0.0) {
        dVar30 = sqrt(dVar29);
      }
      else {
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar29;
        auVar4 = vsqrtsd_avx(auVar39,auVar39);
        dVar30 = auVar4._0_8_;
      }
      dVar28 = dVar30 * 0.5;
      dVar30 = 0.5 / dVar30;
      dVar40 = (dVar22 + dVar57) * dVar30;
      dVar29 = (dVar21 + dVar53) * dVar30;
      dVar53 = dVar59 - dVar55;
    }
    dVar30 = dVar53 * dVar30;
  }
  (__return_storage_ptr__->pos).m_data[0] = auVar1._0_8_;
  (__return_storage_ptr__->pos).m_data[1] = auVar2._0_8_;
  (__return_storage_ptr__->pos).m_data[2] = auVar3._0_8_;
  (__return_storage_ptr__->rot).m_data[0] = dVar30;
  (__return_storage_ptr__->rot).m_data[1] = dVar28;
  (__return_storage_ptr__->rot).m_data[2] = dVar40;
  (__return_storage_ptr__->rot).m_data[3] = dVar29;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteSpherical::GetLinkRelativeCoords() {
    ChVector<> pos1 = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_pos1));

    ChVector<> u = (m_pos2 - pos1).GetNormalized();
    ChVector<> w = Body2->TransformDirectionParentToLocal(Body1->TransformDirectionLocalToParent(m_dir1));
    ChVector<> v = Vcross(w, u);
    ChMatrix33<> A(u, v, w);

    return ChCoordsys<>(pos1, A.Get_A_quaternion());
}